

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O1

int GetCombinedHistogramEntropy
              (VP8LHistogram *a,VP8LHistogram *b,int64_t cost_threshold_in,uint64_t *cost,
              uint64_t *costs)

{
  uint32_t *puVar1;
  uint64_t uVar2;
  int iVar3;
  uint64_t uVar4;
  uint64_t cost_threshold;
  ulong uVar5;
  uint32_t *puVar6;
  bool bVar7;
  VP8LBitEntropy bit_entropy;
  VP8LStreaks stats;
  
  if (cost_threshold_in < 1) {
    return 0;
  }
  *cost = 0;
  puVar1 = b->red;
  uVar5 = 0;
  while( true ) {
    if (a->trivial_symbol[uVar5] == 0xffff) {
      bVar7 = true;
    }
    else {
      bVar7 = a->trivial_symbol[uVar5] != b->trivial_symbol[uVar5];
    }
    if (((bVar7) && (a->is_used[uVar5] != '\0')) && (b->is_used[uVar5] != '\0')) {
      puVar6 = a->red;
      switch(uVar5 & 0xffffffff) {
      case 0:
        iVar3 = (*(code *)((long)&DAT_001b9a28 + (long)(int)(&DAT_001b9a28)[uVar5 & 0xffffffff]))
                          (a->literal,puVar1,0x100);
        return iVar3;
      case 2:
        iVar3 = (*(code *)((long)&DAT_001b9a28 + (long)(int)(&DAT_001b9a28)[uVar5 & 0xffffffff]))
                          (a->blue,puVar1,0x100);
        return iVar3;
      case 3:
        iVar3 = (*(code *)((long)&DAT_001b9a28 + (long)(int)(&DAT_001b9a28)[uVar5 & 0xffffffff]))
                          (a->alpha,puVar1,0x100);
        return iVar3;
      case 4:
        puVar6 = a->distance;
      }
      iVar3 = (*(code *)((long)&DAT_001b9a28 + (long)(int)(&DAT_001b9a28)[uVar5 & 0xffffffff]))
                        (puVar6,puVar1,0x100);
      return iVar3;
    }
    if (a->is_used[uVar5] == '\0') {
      uVar4 = b->costs[uVar5];
    }
    else {
      uVar4 = a->costs[uVar5];
    }
    costs[uVar5] = uVar4;
    uVar2 = *cost;
    *cost = uVar4 + uVar2;
    if ((ulong)cost_threshold_in <= uVar4 + uVar2) break;
    uVar5 = uVar5 + 1;
    if (uVar5 == 5) {
      return 1;
    }
  }
  return 0;
}

Assistant:

WEBP_NODISCARD static int GetCombinedHistogramEntropy(
    const VP8LHistogram* const a, const VP8LHistogram* const b,
    int64_t cost_threshold_in, uint64_t* cost, uint64_t costs[5]) {
  int i;
  const uint64_t cost_threshold = (uint64_t)cost_threshold_in;
  assert(a->palette_code_bits == b->palette_code_bits);
  if (cost_threshold_in <= 0) return 0;
  *cost = 0;

  // No need to add the extra cost for length and distance as it is a constant
  // that does not influence the histograms.
  for (i = 0; i < 5; ++i) {
    costs[i] = GetCombinedEntropy(a, b, (HistogramIndex)i);
    *cost += costs[i];
    if (*cost >= cost_threshold) return 0;
  }

  return 1;
}